

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_CCtx_params *pZVar1;
  undefined1 in_stack_00000020 [24];
  
  pZVar1 = ZSTD_createCCtxParams_advanced((ZSTD_customMem)in_stack_00000020);
  return pZVar1;
}

Assistant:

ZSTD_CCtx_params* ZSTD_createCCtxParams(void)
{
    return ZSTD_createCCtxParams_advanced(ZSTD_defaultCMem);
}